

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::ItemHoverable(ImRect *bb,ImGuiID id)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  if ((((((GImGui->HoveredId == 0) || (GImGui->HoveredId == id)) ||
        ((GImGui->HoveredIdAllowOverlap & 1U) != 0)) &&
       (window_00 = GImGui->CurrentWindow, GImGui->HoveredWindow == window_00)) &&
      ((((GImGui->ActiveId == 0 || (GImGui->ActiveId == id)) ||
        ((GImGui->ActiveIdAllowOverlap & 1U) != 0)) &&
       ((bVar2 = IsMouseHoveringRect(&bb->Min,&bb->Max,true), bVar2 &&
        ((pIVar1->NavDisableMouseHover & 1U) == 0)))))) &&
     (bVar2 = IsWindowContentHoverable(window_00,0), bVar2)) {
    if (((window_00->DC).ItemFlags & 4U) == 0) {
      SetHoveredID(id);
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

bool ImGui::ItemHoverable(const ImRect& bb, ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    if (g.HoveredId != 0 && g.HoveredId != id && !g.HoveredIdAllowOverlap)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (g.HoveredWindow != window)
        return false;
    if (g.ActiveId != 0 && g.ActiveId != id && !g.ActiveIdAllowOverlap)
        return false;
    if (!IsMouseHoveringRect(bb.Min, bb.Max))
        return false;
    if (g.NavDisableMouseHover || !IsWindowContentHoverable(window, ImGuiHoveredFlags_Default))
        return false;
    if (window->DC.ItemFlags & ImGuiItemFlags_Disabled)
        return false;

    SetHoveredID(id);
    return true;
}